

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

char __thiscall Tokenizer::handleEscapeSequence(Tokenizer *this)

{
  byte bVar1;
  char cVar2;
  runtime_error *this_00;
  uint uVar3;
  string local_60;
  string local_40;
  
  bVar1 = Stream::peek(&this->stream_);
  if (bVar1 < 0x66) {
    uVar3 = bVar1 - 0x22;
    if (uVar3 < 0x40) {
      if ((0x400000020000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        return bVar1;
      }
      if ((ulong)uVar3 == 0x3f) {
        return '\a';
      }
    }
    if (bVar1 != 0x62) goto switchD_001366b4_caseD_6f;
    cVar2 = '\b';
  }
  else {
    switch(bVar1) {
    case 0x6e:
      cVar2 = '\n';
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
switchD_001366b4_caseD_6f:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Unexpected escape sequence!","");
      makeErrorMessage(&local_40,this,&local_60);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x72:
      cVar2 = '\r';
      break;
    case 0x74:
      cVar2 = '\t';
      break;
    case 0x76:
      cVar2 = '\v';
      break;
    default:
      if (bVar1 != 0x66) goto switchD_001366b4_caseD_6f;
      cVar2 = '\f';
    }
  }
  return cVar2;
}

Assistant:

char Tokenizer::handleEscapeSequence() const
{
  switch(stream_.peek())
  {
    case '\"':
      return '\"';
    case '\'':
      return '\'';
    case '\\':
      return '\\';
    case '\?':
      return '\?';
    case 'a':
      return '\a';
    case 'b':
      return '\b';
    case 't':
      return '\t';
    case 'v':
      return '\v';
    case 'n':
      return '\n';
    case 'r':
      return '\r';
    case 'f':
      return '\f';
    default:
      throw std::runtime_error(makeErrorMessage("Unexpected escape sequence!"));
  }
}